

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O0

void __thiscall OpenNN::NeuralNetwork::print_network(NeuralNetwork *this)

{
  size_type sVar1;
  ostream *poVar2;
  void *pvVar3;
  reference ppLVar4;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m;
  reference ppMVar5;
  undefined1 local_38 [8];
  MatrixXd weight_matrix;
  Layer *layer;
  int i;
  int layer_count;
  NeuralNetwork *this_local;
  
  sVar1 = std::vector<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>::size
                    (&this->network_layers);
  for (layer._0_4_ = 0; (int)layer < (int)sVar1; layer._0_4_ = (int)layer + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Values for layer ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(int)layer + 1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    ppLVar4 = std::vector<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>::at
                        (&this->network_layers,(long)(int)layer);
    weight_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = (Index)*ppLVar4;
    m = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
        Layer::to_matrix((Layer *)weight_matrix.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols);
    poVar2 = Eigen::operator<<((ostream *)&std::cout,m);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((int)layer != (int)sVar1 + -1) {
      ppMVar5 = std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                ::at(&this->weight_matrices,(long)(int)layer);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_38,*ppMVar5);
      poVar2 = std::operator<<((ostream *)&std::cout,"Weight matrix for layer ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,(int)layer + 1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      poVar2 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"____________________");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void OpenNN::NeuralNetwork::print_network()
{
    int layer_count = this->network_layers.size();
    for (int i = 0; i < layer_count; i++)
    {
        std::cout << "Values for layer " << (i + 1) << std::endl;
        Layer* layer = this->network_layers.at(i);
        std::cout << *layer->to_matrix() << std::endl;
        if (i != (layer_count - 1)) {
            Eigen::MatrixXd weight_matrix = *this->weight_matrices.at(i);
            std::cout << "Weight matrix for layer " << (i+1) << std::endl;
            std::cout << weight_matrix << std::endl;
        }
        std::cout << "____________________" << std::endl;
    }
}